

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O0

void __thiscall
bezier::Bezier<3UL>::Bezier
          (Bezier<3UL> *this,vector<bezier::Vec2,_std::allocator<bezier::Vec2>_> *controlPoints)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  size_t sVar4;
  const_reference pvVar5;
  reference pvVar6;
  ulong local_20;
  size_t i;
  vector<bezier::Vec2,_std::allocator<bezier::Vec2>_> *controlPoints_local;
  Bezier<3UL> *this_local;
  
  std::array<bezier::Vec2,_4UL>::array(&this->mControlPoints);
  sVar3 = std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::size(controlPoints);
  sVar4 = size(this);
  if (sVar3 == sVar4) {
    local_20 = 0;
    while( true ) {
      sVar3 = std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::size(controlPoints);
      if (sVar3 <= local_20) break;
      pvVar5 = std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::operator[]
                         (controlPoints,local_20);
      dVar1 = pvVar5->x;
      dVar2 = pvVar5->y;
      pvVar6 = std::array<bezier::Vec2,_4UL>::operator[](&this->mControlPoints,local_20);
      pvVar6->x = dVar1;
      pvVar6->y = dVar2;
      local_20 = local_20 + 1;
    }
    return;
  }
  __assert_fail("controlPoints.size() == size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/include/bezier/bezier.h"
                ,0x278,"bezier::Bezier<3>::Bezier(const std::vector<Point> &) [N = 3]");
}

Assistant:

explicit Bezier(const std::vector<Point>& controlPoints)
        {
            assert(controlPoints.size() == size()); // The bezier curve must be initialized with the expected number of points
            for (size_t i = 0; i < controlPoints.size(); i++)
                mControlPoints[i] = Point(controlPoints[i]);
        }